

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O1

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceHeaderDataChanged
          (QSortFilterProxyModelPrivate *this,Orientation orientation,int start,int end)

{
  int _t2;
  QObject *this_00;
  Span *pSVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int _t3;
  int iVar9;
  long in_FS_OFFSET;
  const_iterator cVar10;
  QArrayData *local_58;
  int *piStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  local_58 = (QArrayData *)0xffffffffffffffff;
  piStack_50 = (int *)0x0;
  tStack_48.ptr = (QAbstractItemModel *)0x0;
  cVar10 = create_mapping(this,(QModelIndex *)&local_58);
  pSVar1 = (cVar10.i.d)->spans;
  uVar6 = cVar10.i.bucket >> 7;
  lVar5 = *(long *)(pSVar1[uVar6].entries[pSVar1[uVar6].offsets[(uint)cVar10.i.bucket & 0x7f]].
                    storage.data + 0x18);
  local_58 = (QArrayData *)0x0;
  piStack_50 = (int *)0x0;
  tStack_48.ptr = (QAbstractItemModel *)0x0;
  QList<int>::reserve((QList<int> *)&local_58,(long)((end - start) + 1));
  lVar7 = lVar5 + 0x30;
  if (orientation != Vertical) {
    lVar7 = lVar5 + 0x48;
  }
  lVar5 = *(long *)(lVar7 + 8);
  if ((long)start * 4 + lVar5 != (long)end * 4 + 4 + lVar5) {
    lVar7 = (long)start << 2;
    do {
      if (*(int *)(lVar5 + lVar7) != -1) {
        local_3c = *(int *)(lVar5 + lVar7);
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)&local_58,(qsizetype)tStack_48.ptr,&local_3c);
        QList<int>::end((QList<int> *)&local_58);
      }
      lVar7 = lVar7 + 4;
    } while ((long)end * 4 + 4 != lVar7);
  }
  iVar3 = QList<int>::begin((QList<int> *)&local_58);
  iVar4 = QList<int>::end((QList<int> *)&local_58);
  if (iVar3.i != iVar4.i) {
    uVar6 = (long)iVar4.i - (long)iVar3.i >> 2;
    lVar5 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::__introsort_loop<QList<int>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar3.i,iVar4.i,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar3.i,iVar4.i);
  }
  iVar9 = (int)tStack_48.ptr;
  iVar8 = 0;
  do {
    if (iVar9 <= iVar8) {
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,4,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    _t2 = piStack_50[iVar8];
    _t3 = _t2;
    iVar2 = iVar8 + 1;
    if (iVar8 + 1 < iVar9) {
      lVar5 = (long)iVar8 + 1;
      _t3 = (_t2 + iVar9 + -1) - iVar8;
      iVar8 = _t2;
      do {
        if (iVar8 + 1 != piStack_50[lVar5]) {
          _t3 = iVar8;
          iVar2 = (int)lVar5;
          break;
        }
        lVar5 = lVar5 + 1;
        iVar8 = iVar8 + 1;
        iVar2 = iVar9;
      } while (lVar5 < iVar9);
    }
    iVar8 = iVar2;
    QAbstractItemModel::headerDataChanged((QAbstractItemModel *)this_00,orientation,_t2,_t3);
  } while( true );
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceHeaderDataChanged(Qt::Orientation orientation,
                                                           int start, int end)
{
    Q_ASSERT(start <= end);

    Q_Q(QSortFilterProxyModel);
    Mapping *m = create_mapping(QModelIndex()).value();

    const QList<int> &source_to_proxy = (orientation == Qt::Vertical) ? m->proxy_rows : m->proxy_columns;

    QList<int> proxy_positions;
    proxy_positions.reserve(end - start + 1);
    {
        Q_ASSERT(source_to_proxy.size() > end);
        QList<int>::const_iterator it = source_to_proxy.constBegin() + start;
        const QList<int>::const_iterator endIt = source_to_proxy.constBegin() + end + 1;
        for ( ; it != endIt; ++it) {
            if (*it != -1)
                proxy_positions.push_back(*it);
        }
    }

    std::sort(proxy_positions.begin(), proxy_positions.end());

    int last_index = 0;
    const int numItems = proxy_positions.size();
    while (last_index < numItems) {
        const int proxyStart = proxy_positions.at(last_index);
        int proxyEnd = proxyStart;
        ++last_index;
        for (int i = last_index; i < numItems; ++i) {
            if (proxy_positions.at(i) == proxyEnd + 1) {
                ++last_index;
                ++proxyEnd;
            } else {
                break;
            }
        }
        emit q->headerDataChanged(orientation, proxyStart, proxyEnd);
    }
}